

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O0

bool export_scene_anim_as_obj
               (ogt_vox_scene *scene,string *out_name,bool out_file_per_frame,float voxel_scale,
               uint32_t frame_min,uint32_t frame_max,char *mesh_algorithm)

{
  float fVar1;
  uint *puVar2;
  ogt_mesh_vertex *poVar3;
  value_type poVar4;
  uint32_t uVar5;
  int iVar6;
  char *pcVar7;
  FILE *pFVar8;
  undefined8 uVar9;
  reference ppoVar10;
  ogt_mesh_vec3 *poVar11;
  ogt_mesh_vec3 oVar12;
  float local_a40;
  float local_a3c;
  ogt_mesh *local_a38;
  ogt_mesh *local_a28;
  ogt_mesh *local_a18;
  uint32_t n_i2;
  uint32_t n_i1;
  uint32_t n_i0;
  uint32_t t_i2;
  uint32_t t_i1;
  uint32_t t_i0;
  uint32_t v_i2;
  uint32_t v_i1;
  uint32_t v_i0;
  size_t i_5;
  float local_984;
  float fStack_980;
  ogt_mesh_vec3 pos_1;
  size_t i_4;
  float local_95c;
  float fStack_958;
  ogt_mesh_vec3 pos;
  size_t i_3;
  size_t i_2;
  float *transform_data;
  ogt_mesh *mesh;
  uint32_t normal_index;
  ogt_mesh_vec3 *normal;
  uint32_t i_1;
  ogt_mesh *mesh_1;
  ogt_vox_model *model;
  undefined1 local_900 [4];
  uint32_t model_index;
  ogt_vox_transform transform;
  ogt_vox_instance *instance;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0 [4];
  uint32_t instance_index;
  string out_obj_name_1;
  string local_890 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830 [8];
  string out_obj_name;
  uint32_t local_810;
  int local_80c;
  uint32_t frame_index;
  uint32_t base_vertex_index;
  FILE *fout_2;
  bool error;
  FILE *fout_1;
  uint8_t local_7e8 [4];
  uint32_t j;
  uint8_t tga_data [768];
  FILE *fout;
  string out_material_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8 [8];
  string out_texture_name;
  value_type local_488;
  undefined1 local_480 [8];
  vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> meshes;
  ogt_voxel_meshify_context meshify_context;
  ogt_mesh_rgba local_448;
  uint32_t i;
  ogt_vox_palette palette;
  char *mesh_algorithm_local;
  uint32_t frame_max_local;
  uint32_t frame_min_local;
  float voxel_scale_local;
  bool out_file_per_frame_local;
  string *out_name_local;
  ogt_vox_scene *scene_local;
  
  palette.color._1016_8_ = mesh_algorithm;
  mesh_algorithm_local._0_4_ = frame_max;
  mesh_algorithm_local._4_4_ = frame_min;
  frame_max_local = (uint32_t)voxel_scale;
  frame_min_local._3_1_ = out_file_per_frame;
  _voxel_scale_local = out_name;
  out_name_local = (string *)scene;
  get_frame_min_max(scene,(uint32_t *)((long)&mesh_algorithm_local + 4),
                    (uint32_t *)&mesh_algorithm_local);
  memcpy(&local_448,out_name_local + 0x30,0x400);
  for (meshify_context.alloc_free_user_data._4_4_ = 0;
      meshify_context.alloc_free_user_data._4_4_ < 0x100;
      meshify_context.alloc_free_user_data._4_4_ = meshify_context.alloc_free_user_data._4_4_ + 1) {
    (&local_448)[meshify_context.alloc_free_user_data._4_4_].a =
         (uint8_t)meshify_context.alloc_free_user_data._4_4_;
  }
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::vector
            ((vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> *)local_480);
  local_488 = (value_type)0x0;
  std::vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::resize
            ((vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> *)local_480,
             (ulong)*(uint *)out_name_local,&local_488);
  std::operator+(local_4b8,(char *)_voxel_scale_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                 (char *)_voxel_scale_local);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  pFVar8 = (FILE *)open_file(pcVar7,"wb");
  if (pFVar8 == (FILE *)0x0) {
    uVar9 = std::__cxx11::string::c_str();
    printf("could not open file \'%s\' for write - aborting!",uVar9);
    scene_local._7_1_ = 0;
  }
  else {
    uVar9 = std::__cxx11::string::c_str();
    printf("writing file %s\n",uVar9);
    for (fout_1._4_4_ = 0; fout_1._4_4_ < 0x100; fout_1._4_4_ = fout_1._4_4_ + 1) {
      local_7e8[fout_1._4_4_ * 3] = (&local_448)[fout_1._4_4_].r;
      local_7e8[fout_1._4_4_ * 3 + 1] = (&local_448)[fout_1._4_4_].g;
      local_7e8[fout_1._4_4_ * 3 + 2] = (&local_448)[fout_1._4_4_].b;
    }
    write_tga_24bit(local_7e8,0x100,1,(FILE *)pFVar8);
    fclose(pFVar8);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    pFVar8 = (FILE *)open_file(pcVar7,"wb");
    if (pFVar8 == (FILE *)0x0) {
      uVar9 = std::__cxx11::string::c_str();
      printf("could not open file \'%s\' for write - aborting!",uVar9);
      scene_local._7_1_ = 0;
    }
    else {
      uVar9 = std::__cxx11::string::c_str();
      printf("writing file %s\n",uVar9);
      fprintf(pFVar8,
              "# opengametools vox2animobj - see source code at https://github.com/jpaver/opengametools/tree/master/apps/vox2animobj.cpp\r\n"
             );
      fprintf(pFVar8,"\r\n");
      fprintf(pFVar8,"newmtl palette\r\n");
      fprintf(pFVar8,"illum 1\r\n");
      fprintf(pFVar8,"Ka 0.000 0.000 0.000\r\n");
      fprintf(pFVar8,"Kd 1.000 1.000 1.000\r\n");
      fprintf(pFVar8,"Ks 0.000 0.000 0.000\r\n");
      uVar9 = std::__cxx11::string::c_str();
      fprintf(pFVar8,"map_Kd %s\r\n",uVar9);
      fclose(pFVar8);
      fout_2._7_1_ = 0;
      _frame_index = (FILE *)0x0;
      local_80c = 0;
      for (local_810 = mesh_algorithm_local._4_4_; local_810 <= (uint32_t)mesh_algorithm_local;
          local_810 = local_810 + 1) {
        if ((frame_min_local._3_1_ & 1) == 0) {
          if (_frame_index == (FILE *)0x0) {
            std::operator+(local_8b0,(char *)_voxel_scale_local);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            _frame_index = (FILE *)open_obj_file(pcVar7);
            if (_frame_index == (FILE *)0x0) {
              uVar9 = std::__cxx11::string::c_str();
              printf("could not open file \'%s\' for write - aborting!",uVar9);
              fout_2._7_1_ = 1;
              tga_data[0x2fc] = '\b';
              tga_data[0x2fd] = '\0';
              tga_data[0x2fe] = '\0';
              tga_data[0x2ff] = '\0';
            }
            else {
              tga_data[0x2fc] = '\0';
              tga_data[0x2fd] = '\0';
              tga_data[0x2fe] = '\0';
              tga_data[0x2ff] = '\0';
            }
            std::__cxx11::string::~string((string *)local_8b0);
            goto joined_r0x00118a8c;
          }
        }
        else {
          if (_frame_index != (FILE *)0x0) {
            fclose(_frame_index);
          }
          std::operator+(local_870,(char *)_voxel_scale_local);
          zero_padded_string_abi_cxx11_((uint32_t)local_890,local_810);
          std::operator+(local_850,local_870);
          std::operator+(local_830,(char *)local_850);
          std::__cxx11::string::~string((string *)local_850);
          std::__cxx11::string::~string(local_890);
          std::__cxx11::string::~string((string *)local_870);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          _frame_index = (FILE *)open_obj_file(pcVar7);
          if (_frame_index == (FILE *)0x0) {
            uVar9 = std::__cxx11::string::c_str();
            printf("could not open file \'%s\' for write - aborting!",uVar9);
            fout_2._7_1_ = 1;
            tga_data[0x2fc] = '\b';
            tga_data[0x2fd] = '\0';
            tga_data[0x2fe] = '\0';
            tga_data[0x2ff] = '\0';
          }
          else {
            local_80c = 0;
            tga_data[0x2fc] = '\0';
            tga_data[0x2fd] = '\0';
            tga_data[0x2fe] = '\0';
            tga_data[0x2ff] = '\0';
          }
          std::__cxx11::string::~string((string *)local_830);
joined_r0x00118a8c:
          if (tga_data._764_4_ != 0) break;
        }
        fprintf(_frame_index,"o frame_%03u\n",(ulong)local_810);
        uVar9 = std::__cxx11::string::c_str();
        fprintf(_frame_index,"mtllib %s\n",uVar9);
        fprintf(_frame_index,"usemtl palette\n");
        for (instance._4_4_ = 0; instance._4_4_ < *(uint *)(out_name_local + 4);
            instance._4_4_ = instance._4_4_ + 1) {
          transform._56_8_ = *(long *)(out_name_local + 0x18) + (ulong)instance._4_4_ * 0x78;
          if ((((((ogt_vox_instance *)transform._56_8_)->hidden & 1U) == 0) &&
              ((*(byte *)(*(long *)(out_name_local + 0x20) +
                          (ulong)((ogt_vox_instance *)transform._56_8_)->layer_index * 0x10 + 0xc) &
               1) == 0)) &&
             ((((ogt_vox_instance *)transform._56_8_)->group_index == 0xffffffff ||
              ((*(byte *)(*(long *)(out_name_local + 0x28) +
                          (ulong)((ogt_vox_instance *)transform._56_8_)->group_index * 0x68 + 0x50)
               & 1) == 0)))) {
            ogt_vox_sample_instance_transform_global
                      ((ogt_vox_transform *)local_900,(ogt_vox_instance *)transform._56_8_,local_810
                       ,(ogt_vox_scene *)out_name_local);
            uVar5 = ogt_vox_sample_instance_model((ogt_vox_instance *)transform._56_8_,local_810);
            puVar2 = *(uint **)(*(long *)(out_name_local + 0x10) + (ulong)uVar5 * 8);
            if ((puVar2 != (uint *)0x0) &&
               (ppoVar10 = std::vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::operator[]
                                     ((vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> *)local_480,
                                      (ulong)uVar5), *ppoVar10 == (value_type)0x0)) {
              printf("  - generating mesh for model of size %u x %u x %u using mesh_algorithm %s\n",
                     (ulong)*puVar2,(ulong)puVar2[1],(ulong)puVar2[2],palette.color._1016_8_);
              iVar6 = strcmp((char *)palette.color._1016_8_,"polygon");
              if (iVar6 == 0) {
                local_a18 = ogt_mesh_from_paletted_voxels_polygon
                                      ((ogt_voxel_meshify_context *)
                                       &meshes.
                                        super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       *(uint8_t **)(puVar2 + 4),*puVar2,puVar2[1],puVar2[2],
                                       &local_448);
              }
              else {
                iVar6 = strcmp((char *)palette.color._1016_8_,"greedy");
                if (iVar6 == 0) {
                  local_a28 = ogt_mesh_from_paletted_voxels_greedy
                                        ((ogt_voxel_meshify_context *)
                                         &meshes.
                                          super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         *(uint8_t **)(puVar2 + 4),*puVar2,puVar2[1],puVar2[2],
                                         &local_448);
                }
                else {
                  iVar6 = strcmp((char *)palette.color._1016_8_,"simple");
                  if (iVar6 == 0) {
                    local_a38 = ogt_mesh_from_paletted_voxels_simple
                                          ((ogt_voxel_meshify_context *)
                                           &meshes.
                                            super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           *(uint8_t **)(puVar2 + 4),*puVar2,puVar2[1],puVar2[2],
                                           &local_448);
                  }
                  else {
                    local_a38 = (ogt_mesh *)0x0;
                  }
                  local_a28 = local_a38;
                }
                local_a18 = local_a28;
              }
              for (normal._4_4_ = 0; normal._4_4_ < local_a18->vertex_count;
                  normal._4_4_ = normal._4_4_ + 1) {
                local_a18->vertices[normal._4_4_].pos.x =
                     local_a18->vertices[normal._4_4_].pos.x - (float)(*puVar2 >> 1);
                local_a18->vertices[normal._4_4_].pos.y =
                     local_a18->vertices[normal._4_4_].pos.y - (float)(puVar2[1] >> 1);
                local_a18->vertices[normal._4_4_].pos.z =
                     local_a18->vertices[normal._4_4_].pos.z - (float)(puVar2[2] >> 1);
                poVar3 = local_a18->vertices;
                poVar11 = &poVar3[normal._4_4_].normal;
                if ((poVar11->x != 0.0) || (NAN(poVar11->x))) {
                  local_a3c = (float)(uint)(poVar11->x <= 0.0);
                }
                else {
                  fVar1 = poVar3[normal._4_4_].normal.y;
                  if ((fVar1 != 0.0) || (NAN(fVar1))) {
                    local_a40 = 4.2039e-45;
                    if (0.0 < poVar3[normal._4_4_].normal.y) {
                      local_a40 = 2.8026e-45;
                    }
                  }
                  else {
                    local_a40 = 7.00649e-45;
                    if (0.0 < poVar3[normal._4_4_].normal.z) {
                      local_a40 = 5.60519e-45;
                    }
                  }
                  local_a3c = local_a40;
                }
                poVar11->x = local_a3c;
              }
              ppoVar10 = std::vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::operator[]
                                   ((vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> *)local_480,
                                    (ulong)uVar5);
              *ppoVar10 = local_a18;
            }
            ppoVar10 = std::vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::operator[]
                                 ((vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> *)local_480,
                                  (ulong)uVar5);
            poVar4 = *ppoVar10;
            if (poVar4 != (value_type)0x0) {
              if (((float)frame_max_local != 1.0) || (NAN((float)frame_max_local))) {
                for (i_3 = 0; i_3 < 0x10; i_3 = i_3 + 1) {
                  *(float *)(local_900 + i_3 * 4) =
                       (float)frame_max_local * *(float *)(local_900 + i_3 * 4);
                }
                pos.y = 0.0;
                pos.z = 0.0;
                for (; (ulong)pos._4_8_ < (ulong)poVar4->vertex_count; pos._4_8_ = pos._4_8_ + 1) {
                  oVar12 = transform_point((ogt_vox_transform *)local_900,
                                           &poVar4->vertices[pos._4_8_].pos);
                  local_95c = oVar12.x;
                  fStack_958 = oVar12.y;
                  fprintf(_frame_index,"v %f %f %f\n",SUB84((double)local_95c,0),(double)fStack_958,
                          (double)oVar12.z);
                }
              }
              else {
                pos_1.y = 0.0;
                pos_1.z = 0.0;
                for (; (ulong)pos_1._4_8_ < (ulong)poVar4->vertex_count;
                    pos_1._4_8_ = pos_1._4_8_ + 1) {
                  oVar12 = transform_point((ogt_vox_transform *)local_900,
                                           &poVar4->vertices[pos_1._4_8_].pos);
                  local_984 = oVar12.x;
                  fStack_980 = oVar12.y;
                  fprintf(_frame_index,"v %i %i %i\n",(ulong)(uint)(int)local_984,
                          (ulong)(uint)(int)fStack_980,(ulong)(uint)(int)oVar12.z);
                }
              }
              for (_v_i1 = 0; _v_i1 < poVar4->index_count; _v_i1 = _v_i1 + 3) {
                fprintf(_frame_index,"f %u/%u/%u %u/%u/%u %u/%u/%u\n",
                        (ulong)(local_80c + poVar4->indices[_v_i1] + 1),
                        (ulong)(poVar4->vertices[poVar4->indices[_v_i1]].color.a + 1),
                        (ulong)((int)poVar4->vertices[poVar4->indices[_v_i1]].normal.x + 1),
                        (ulong)(local_80c + poVar4->indices[_v_i1 + 1] + 1),
                        poVar4->vertices[poVar4->indices[_v_i1 + 1]].color.a + 1,
                        (int)poVar4->vertices[poVar4->indices[_v_i1 + 1]].normal.x + 1,
                        local_80c + poVar4->indices[_v_i1 + 2] + 1,
                        poVar4->vertices[poVar4->indices[_v_i1 + 2]].color.a + 1,
                        (int)poVar4->vertices[poVar4->indices[_v_i1 + 2]].normal.x + 1);
              }
              local_80c = poVar4->vertex_count + local_80c;
            }
          }
        }
      }
      if (_frame_index != (FILE *)0x0) {
        fclose(_frame_index);
      }
      scene_local._7_1_ = (fout_2._7_1_ ^ 0xff) & 1;
    }
  }
  tga_data[0x2fc] = '\x01';
  tga_data[0x2fd] = '\0';
  tga_data[0x2fe] = '\0';
  tga_data[0x2ff] = '\0';
  std::__cxx11::string::~string((string *)&fout);
  std::__cxx11::string::~string((string *)local_4b8);
  std::vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::~vector
            ((vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> *)local_480);
  return (bool)(scene_local._7_1_ & 1);
}

Assistant:

bool export_scene_anim_as_obj(const ogt_vox_scene* scene, const std::string& out_name, bool out_file_per_frame, float voxel_scale, uint32_t frame_min, uint32_t frame_max, const char* mesh_algorithm) {
    get_frame_min_max(scene, frame_min, frame_max);

    // put the color index into the alpha component of every color in the palette
    ogt_vox_palette palette = scene->palette;
    for (uint32_t i = 0; i < 256; i++) {
        palette.color[i].a = (uint8_t)i;
    }

    // meshify all models.
    ogt_voxel_meshify_context meshify_context = {};
    std::vector<ogt_mesh*> meshes;
    meshes.resize(scene->num_models, nullptr);

    // go through all frames
    std::string out_texture_name = out_name + ".tga";
    std::string out_material_name = out_name + ".mtl";

    // write palette data as tga
    {
        FILE* fout = open_file(out_texture_name.c_str(), "wb");
        if (!fout) {
            printf("could not open file '%s' for write - aborting!", out_texture_name.c_str());
            return false;
        }

        printf("writing file %s\n", out_texture_name.c_str());
        uint8_t tga_data[256*3];
        for (uint32_t j = 0; j < 256; j++) {
            tga_data[j * 3 + 0] = palette.color[j].r;
            tga_data[j * 3 + 1] = palette.color[j].g;
            tga_data[j * 3 + 2] = palette.color[j].b;
        }
        write_tga_24bit(tga_data, 256, 1, fout);
        fclose(fout);
    }

    // write material data
    {
        FILE* fout = open_file(out_material_name.c_str(), "wb");
        if (!fout) {
            printf("could not open file '%s' for write - aborting!", out_material_name.c_str());
            return false;
        }
        printf("writing file %s\n", out_material_name.c_str());
        fprintf(fout, "# opengametools vox2animobj - see source code at https://github.com/jpaver/opengametools/tree/master/apps/vox2animobj.cpp\r\n"); // TODO(jpaver) proper header
        fprintf(fout, "\r\n");
        fprintf(fout, "newmtl palette\r\n");
        fprintf(fout, "illum 1\r\n");
        fprintf(fout, "Ka 0.000 0.000 0.000\r\n");
        fprintf(fout, "Kd 1.000 1.000 1.000\r\n");
        fprintf(fout, "Ks 0.000 0.000 0.000\r\n");
        fprintf(fout, "map_Kd %s\r\n", out_texture_name.c_str());
        fclose(fout);
    }

    // write geometry data
    bool error = false;
    {
        FILE* fout = nullptr;
        uint32_t base_vertex_index = 0;
        for (uint32_t frame_index = frame_min; frame_index <= frame_max; frame_index++) {
            if (out_file_per_frame) {
                if (fout)
                    fclose(fout);
                std::string out_obj_name = out_name + "-" + zero_padded_string(frame_index, 3) + ".obj";
                fout = open_obj_file(out_obj_name.c_str());
                if (!fout) {
                    printf("could not open file '%s' for write - aborting!", out_obj_name.c_str());
                    error = true;
                    break;
                }
                base_vertex_index = 0;
            }
            else if (!fout) {
                std::string out_obj_name = out_name + ".obj";
                fout = open_obj_file(out_obj_name.c_str());
                if (!fout) {
                    printf("could not open file '%s' for write - aborting!", out_obj_name.c_str());
                    error = true;
                    break;
                }
            }

            fprintf(fout, "o frame_%03u\n", frame_index);
            fprintf(fout, "mtllib %s\n", out_material_name.c_str());
            fprintf(fout, "usemtl palette\n");

            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                const ogt_vox_instance* instance = &scene->instances[instance_index];
                // skip this instance if it's hidden in the .vox file
                if (instance->hidden)
                    continue;
                // skip this instance if it's part of a hidden layer in the .vox file
                if (scene->layers[instance->layer_index].hidden)
                    continue;
                // skip this instance if it's part of a hidden group
                if (instance->group_index != k_invalid_group_index && scene->groups[instance->group_index].hidden)
                    continue;

                ogt_vox_transform transform   = ogt_vox_sample_instance_transform_global(instance, frame_index, scene);
                uint32_t          model_index = ogt_vox_sample_instance_model(instance, frame_index);

                // just in time generate the mesh for this model if we haven't already done so.
                const ogt_vox_model* model = scene->models[model_index];
                if (model && !meshes[model_index]) {
                    // generate a mesh for this model using the mesh_algorithm specified
                    printf("  - generating mesh for model of size %u x %u x %u using mesh_algorithm %s\n", model->size_x, model->size_y, model->size_z, mesh_algorithm);
                    ogt_mesh* mesh =
                        (strcmp(mesh_algorithm, "polygon") == 0) ? ogt_mesh_from_paletted_voxels_polygon(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        (strcmp(mesh_algorithm, "greedy") == 0) ? ogt_mesh_from_paletted_voxels_greedy(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        (strcmp(mesh_algorithm, "simple") == 0) ? ogt_mesh_from_paletted_voxels_simple(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        NULL;

                    for (uint32_t i = 0; i < mesh->vertex_count; i++) {
                        // pre-bias the mesh vertices by the model dimensions - resets the center/pivot so it is at (0,0,0)
                        mesh->vertices[i].pos.x -= (float)(model->size_x / 2);
                        mesh->vertices[i].pos.y -= (float)(model->size_y / 2);
                        mesh->vertices[i].pos.z -= (float)(model->size_z / 2);
                        // the normal is always a unit vector aligned on one of the 6 cardinal directions, here we just
                        // precompute which index it was (same order as the 'vn' tags we wrote out when opening the file)
                        // and write it as a uint32_t into the x field. This allows us to avoid do this index conversion
                        // for every vert in a mesh, and not for every vert multiplied by the number of instances.
                        ogt_mesh_vec3& normal = mesh->vertices[i].normal;
                        uint32_t normal_index = normal.x != 0 ? (normal.x > 0.0f ? 0 : 1) :
                                                normal.y != 0 ? (normal.y > 0.0f ? 2 : 3) :
                                                (normal.z > 0.0f ? 4 : 5);
                        *(uint32_t*)&normal.x = normal_index;
                    }
                    // cache this mesh so we don't need to do it multiple times.
                    meshes[model_index] = mesh;
                }

                // some instances can have no geometry, so we just skip em
                const ogt_mesh* mesh = meshes[model_index];
                if (!mesh)
                    continue;

                if (voxel_scale != 1.0f) {
                    // bake voxel scale into the transform to avoid doing the scale per vertex.
                    float* transform_data = &transform.m00;
                    for (size_t i = 0; i < 16; i++) {
                        transform_data[i] *= voxel_scale;
                    }
                    // scaling vertex positions, so we do floating point writes
                    for (size_t i = 0; i < mesh->vertex_count; i++) {
                        ogt_mesh_vec3 pos = transform_point(transform, mesh->vertices[i].pos);
                        fprintf(fout, "v %f %f %f\n", pos.x, pos.y, pos.z);
                    }
                }
                else {
                    // we're not scaling positions, can write them much more compactly (smaller .obj file size) as int.
                    for (size_t i = 0; i < mesh->vertex_count; i++) {
                        ogt_mesh_vec3 pos = transform_point(transform, mesh->vertices[i].pos);
                        fprintf(fout, "v %i %i %i\n", (int32_t)pos.x, (int32_t)pos.y, (int32_t)pos.z);
                    }
                }
                // write faces
                for (size_t i = 0; i < mesh->index_count; i += 3) {
                    uint32_t v_i0 = base_vertex_index + mesh->indices[i + 0] + 1;
                    uint32_t v_i1 = base_vertex_index + mesh->indices[i + 1] + 1;
                    uint32_t v_i2 = base_vertex_index + mesh->indices[i + 2] + 1;
                    uint32_t t_i0 = mesh->vertices[mesh->indices[i+0]].color.a + 1;
                    uint32_t t_i1 = mesh->vertices[mesh->indices[i+1]].color.a + 1;
                    uint32_t t_i2 = mesh->vertices[mesh->indices[i+2]].color.a + 1;
                    uint32_t n_i0 = *((uint32_t*)&mesh->vertices[mesh->indices[i+0]].normal.x) + 1;
                    uint32_t n_i1 = *((uint32_t*)&mesh->vertices[mesh->indices[i+1]].normal.x) + 1;
                    uint32_t n_i2 = *((uint32_t*)&mesh->vertices[mesh->indices[i+2]].normal.x) + 1;
                    fprintf(fout, "f %u/%u/%u %u/%u/%u %u/%u/%u\n", v_i0, t_i0, n_i0, v_i1, t_i1, n_i1, v_i2, t_i2, n_i2);
                }
                base_vertex_index += mesh->vertex_count;
            }
        }

        if (fout) {
            fclose(fout);
        }
    }
    return !error;
}